

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io_extract.hpp
# Opt level: O3

string * file_io::extract_content(string *__return_storage_ptr__,string *__file_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  istream *piVar8;
  undefined8 extraout_RAX;
  byte bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string _line;
  regex _whitespace;
  ifstream _input_file;
  undefined1 local_308 [24];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_2f0;
  string *local_2e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  long local_2d0;
  char local_2c8;
  undefined7 uStack_2c7;
  string local_2b8;
  string local_298;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [65];
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_2e0 = __return_storage_ptr__;
  std::ifstream::ifstream(local_238,(string *)__file_path,_S_in);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Extracting content from: ",0x19);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(__file_path->_M_dataplus)._M_p,
                      __file_path->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::operator+(&local_258,"Cannot open file at: ",__file_path);
    exit_error_code(3,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    std::ifstream::~ifstream(local_238);
    pcVar2 = (local_2e0->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_278,"\\s+",0x10);
  local_2d8._M_current = &local_2c8;
  local_2d0 = 0;
  local_2c8 = '\0';
  bVar9 = 0;
  bVar3 = false;
  bVar6 = false;
LAB_00109318:
  while( true ) {
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2d8,cVar4);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
        if (local_2d8._M_current != &local_2c8) {
          operator_delete(local_2d8._M_current,CONCAT71(uStack_2c7,local_2c8) + 1);
        }
        std::ifstream::close();
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_278)
        ;
        std::ifstream::~ifstream(local_238);
        return local_2e0;
      }
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_2d8._M_current,local_2d8._M_current + local_2d0);
      bVar5 = is_frontmatter_tag(&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((~bVar5 & 1U) != 0 || bVar9 != 0) break;
      bVar9 = 1;
    }
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b8,local_2d8._M_current,local_2d8._M_current + local_2d0);
    bVar5 = is_frontmatter_tag(&local_2b8);
    if ((bVar5 & bVar9) != 1) goto LAB_00109408;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) break;
    bVar9 = 1;
    bVar3 = true;
  }
  goto LAB_00109429;
LAB_00109408:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (bVar9 != 1 || bVar3) {
LAB_00109429:
    local_308._16_8_ = (pointer)0x0;
    _Stack_2f0._M_current = (char *)0x0;
    local_308._0_8_ = (pointer)0x0;
    local_308._8_8_ = (pointer)0x0;
    bVar5 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      (local_2d8,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_2d8._M_current + local_2d0),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_308,&local_278,0);
    if ((pointer)local_308._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
    }
    if ((~bVar5 & local_2d0 != 0) != 0 || bVar6) {
      local_308._0_8_ = local_308 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_308,local_2d8._M_current,local_2d8._M_current + local_2d0);
      std::__cxx11::string::append((char *)local_308);
      std::__cxx11::string::_M_append((char *)local_2e0,local_308._0_8_);
      if ((pointer)local_308._0_8_ != (pointer)(local_308 + 0x10)) {
        operator_delete((void *)local_308._0_8_,
                        (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_308._16_8_)->first)._M_current + 1));
      }
      bVar6 = true;
    }
  }
  goto LAB_00109318;
}

Assistant:

std::string extract_content(std::string __file_path) {
        std::string _output;
        std::ifstream _input_file(__file_path);
        std::cout << "Extracting content from: " << __file_path << std::endl;
        if (!_input_file.is_open())
            exit_error_code(3, "Cannot open file at: " + __file_path);		

        std::regex _whitespace("\\s+");
        bool _is_opening_tag_parse = false, _is_closing_tag_parse = false, _content_start = false;
        for (std::string _line; std::getline(_input_file, _line);) {
            if (is_frontmatter_tag(_line) && !_is_opening_tag_parse)
                _is_opening_tag_parse = true;
            else if (is_frontmatter_tag(_line) && _is_opening_tag_parse && !_is_closing_tag_parse)
                _is_closing_tag_parse = true;
            else if ((_is_opening_tag_parse && !_is_closing_tag_parse) || ((regex_match(_line, _whitespace) || _line.empty()) && !_content_start))
                continue;
            else {
                _output += _line + "\n";
                _content_start = true;
            }
        }

        _input_file.close();
        return _output;
    }